

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_predictive_coefficients_to_line_spectral_pairs.cc
# Opt level: O0

bool __thiscall
sptk::LinearPredictiveCoefficientsToLineSpectralPairs::Run
          (LinearPredictiveCoefficientsToLineSpectralPairs *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *line_spectral_pairs,Buffer *buffer)

{
  value_type vVar1;
  double dVar2;
  vector<double,_std::allocator<double>_> *pvVar3;
  double dVar4;
  int iVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  size_type sVar8;
  const_reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  long in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  double in_RDI;
  double x_interpolated;
  double y_mid;
  double x_mid;
  int n;
  double y_upper;
  double y_lower;
  double x_upper;
  double x_lower;
  double y;
  double x;
  double x_min;
  double x_max;
  double delta;
  double *w;
  double y_prev;
  double x_prev;
  int order;
  vector<double,_std::allocator<double>_> *c;
  int i_1;
  int i;
  double *p2;
  double *p1;
  double *c2;
  double *c1;
  long local_100;
  double local_f8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  int local_c4;
  double local_c0;
  double local_b8;
  vector<double,_std::allocator<double>_> *local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  double local_a0;
  vector<double,_std::allocator<double>_> *local_98;
  double local_70;
  vector<double,_std::allocator<double>_> *local_68;
  int local_5c;
  long local_58;
  int local_50;
  int local_4c;
  double *local_48;
  double *local_40;
  bool local_1;
  
  if (((((*(byte *)((long)in_RDI + 0x28) & 1) == 0) ||
       (sVar8 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar8 != (long)(*(int *)((long)in_RDI + 8) + 1))) ||
      (in_RDX == (vector<double,_std::allocator<double>_> *)0x0)) || (in_RCX == 0)) {
    local_1 = false;
  }
  else {
    sVar8 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar8 != (long)(*(int *)((long)in_RDI + 8) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff20,(size_type)in_RDI);
    }
    sVar8 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 8));
    if (sVar8 != (long)(*(int *)((long)in_RDI + 0xc) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff20,(size_type)in_RDI);
    }
    sVar8 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20));
    if (sVar8 != (long)(*(int *)((long)in_RDI + 0x10) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff20,(size_type)in_RDI);
    }
    pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    vVar1 = *pvVar9;
    pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    *pvVar10 = vVar1;
    if (*(int *)((long)in_RDI + 8) == 0) {
      local_1 = true;
    }
    else {
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RCX + 8),0);
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20),0);
      pvVar10[*(int *)((long)in_RDI + 0xc)] = 1.0;
      pvVar11[*(int *)((long)in_RDI + 0x10)] = 1.0;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
      local_40 = pvVar9 + 1;
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
      local_48 = pvVar9 + *(int *)((long)in_RDI + 8);
      if (*(int *)((long)in_RDI + 8) % 2 == 0) {
        iVar5 = *(int *)((long)in_RDI + 0xc);
        while (local_4c = iVar5 + -1, -1 < local_4c) {
          pvVar10[local_4c] = (*local_40 + *local_48) - pvVar10[iVar5];
          pvVar11[local_4c] = (*local_40 - *local_48) + pvVar11[iVar5];
          local_40 = local_40 + 1;
          local_48 = local_48 + -1;
          iVar5 = local_4c;
        }
      }
      else {
        iVar5 = *(int *)((long)in_RDI + 0x10);
        while (local_50 = iVar5 + -1, -1 < local_50) {
          pvVar10[iVar5] = *local_40 + *local_48;
          if (local_50 == *(int *)((long)in_RDI + 0x10) + -1) {
            local_f8 = *local_40 - *local_48;
          }
          else {
            local_f8 = (*local_40 - *local_48) + pvVar11[iVar5 + 1];
          }
          pvVar11[local_50] = local_f8;
          local_40 = local_40 + 1;
          local_48 = local_48 + -1;
          iVar5 = local_50;
        }
        *pvVar10 = *local_40 + *local_48;
      }
      *pvVar10 = *pvVar10 * 0.5;
      *pvVar11 = *pvVar11 * 0.5;
      local_58 = in_RCX + 8;
      local_5c = 0;
      local_68 = (vector<double,_std::allocator<double>_> *)0x3ff0000000000000;
      local_70 = anon_unknown.dwarf_70e6::CalculateChebyshevPolynomial
                           (in_stack_ffffffffffffff20,in_RDI);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
      dVar2 = 1.0 / (double)*(int *)((long)in_RDI + 0x14);
      for (local_98 = (vector<double,_std::allocator<double>_> *)(1.0 - dVar2);
          -1.0 - dVar2 < (double)local_98;
          local_98 = (vector<double,_std::allocator<double>_> *)((double)local_98 - dVar2)) {
        local_b8 = anon_unknown.dwarf_70e6::CalculateChebyshevPolynomial
                             (in_stack_ffffffffffffff20,in_RDI);
        local_a0 = local_b8;
        if (local_b8 * local_70 <= 0.0) {
          local_a8 = local_98;
          local_b0 = local_68;
          local_c0 = local_70;
          for (local_c4 = 0; local_c4 < *(int *)((long)in_RDI + 0x18); local_c4 = local_c4 + 1) {
            pvVar3 = (vector<double,_std::allocator<double>_> *)
                     (((double)local_a8 + (double)local_b0) * 0.5);
            dVar4 = anon_unknown.dwarf_70e6::CalculateChebyshevPolynomial
                              (in_stack_ffffffffffffff20,in_RDI);
            dVar6 = dVar4;
            pvVar7 = pvVar3;
            if (dVar4 * local_c0 <= 0.0) {
              dVar6 = local_c0;
              local_b8 = dVar4;
              pvVar7 = local_b0;
              local_a8 = pvVar3;
            }
            local_b0 = pvVar7;
            local_c0 = dVar6;
            if (ABS(dVar4) <= *(double *)((long)in_RDI + 0x20)) break;
          }
          local_98 = (vector<double,_std::allocator<double>_> *)
                     ((local_b8 * (double)local_b0 + -(local_c0 * (double)local_a8)) /
                     (local_b8 - local_c0));
          dVar4 = acos((double)local_98);
          local_5c = local_5c + 1;
          pvVar10[local_5c] = dVar4 / 6.283185307179586;
          if (*(int *)((long)in_RDI + 8) == local_5c) {
            return true;
          }
          if (local_58 == in_RCX + 8) {
            local_100 = in_RCX + 0x20;
          }
          else {
            local_100 = in_RCX + 8;
          }
          local_58 = local_100;
          in_stack_ffffffffffffff20 = local_98;
          local_a0 = anon_unknown.dwarf_70e6::CalculateChebyshevPolynomial(local_98,in_RDI);
        }
        local_68 = local_98;
        local_70 = local_a0;
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool LinearPredictiveCoefficientsToLineSpectralPairs::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* line_spectral_pairs,
    LinearPredictiveCoefficientsToLineSpectralPairs::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(num_order_ + 1) ||
      NULL == line_spectral_pairs || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (line_spectral_pairs->size() != static_cast<std::size_t>(num_order_ + 1)) {
    line_spectral_pairs->resize(num_order_ + 1);
  }
  if (buffer->c1_.size() !=
      static_cast<std::size_t>(num_symmetric_polynomial_order_ + 1)) {
    buffer->c1_.resize(num_symmetric_polynomial_order_ + 1);
  }
  if (buffer->c2_.size() !=
      static_cast<std::size_t>(num_asymmetric_polynomial_order_ + 1)) {
    buffer->c2_.resize(num_asymmetric_polynomial_order_ + 1);
  }

  // Copy gain.
  (*line_spectral_pairs)[0] = linear_predictive_coefficients[0];
  if (0 == num_order_) return true;

  // Calculate symmetric and antisymmetric polynomials.
  double* c1(&buffer->c1_[0]);
  double* c2(&buffer->c2_[0]);
  {
    c1[num_symmetric_polynomial_order_] = 1.0;
    c2[num_asymmetric_polynomial_order_] = 1.0;
    const double* p1(&(linear_predictive_coefficients[0]) + 1);
    const double* p2(&(linear_predictive_coefficients[0]) + num_order_);
    if (num_order_ % 2 == 0) {
      for (int i(num_symmetric_polynomial_order_ - 1); 0 <= i;
           --i, ++p1, --p2) {
        c1[i] = *p1 + *p2 - c1[i + 1];
        c2[i] = *p1 - *p2 + c2[i + 1];
      }
    } else {
      for (int i(num_asymmetric_polynomial_order_ - 1); 0 <= i;
           --i, ++p1, --p2) {
        c1[i + 1] = *p1 + *p2;
        c2[i] = (i == num_asymmetric_polynomial_order_ - 1)
                    ? *p1 - *p2
                    : *p1 - *p2 + c2[i + 2];
      }
      c1[0] = *p1 + *p2;
    }
    c1[0] *= 0.5;
    c2[0] *= 0.5;
  }

  const std::vector<double>* c(&buffer->c1_);
  int order(0);
  double x_prev(1.0);
  double y_prev(CalculateChebyshevPolynomial(*c, x_prev));
  double* w(&((*line_spectral_pairs)[0]));

  // Search roots of polynomials.
  const double delta(1.0 / num_split_);
  const double x_max(1.0 - delta);
  const double x_min(-1.0 - delta);
  for (double x(x_max); x_min < x; x -= delta) {
    double y(CalculateChebyshevPolynomial(*c, x));

    if (y * y_prev <= 0.0) {
      double x_lower(x);
      double x_upper(x_prev);
      double y_lower(y);
      double y_upper(y_prev);

      for (int n(0); n < num_iteration_; ++n) {
        const double x_mid((x_lower + x_upper) * 0.5);
        const double y_mid(CalculateChebyshevPolynomial(*c, x_mid));

        if (y_mid * y_upper <= 0.0) {
          x_lower = x_mid;
          y_lower = y_mid;
        } else {
          x_upper = x_mid;
          y_upper = y_mid;
        }

        if (std::fabs(y_mid) <= convergence_threshold_) {
          break;
        }
      }

      const double x_interpolated((y_lower * x_upper - y_upper * x_lower) /
                                  (y_lower - y_upper));
      w[++order] = std::acos(x_interpolated) / sptk::kTwoPi;
      if (num_order_ == order) return true;

      // Update variables.
      c = (c == &buffer->c1_) ? &buffer->c2_ : &buffer->c1_;
      x = x_interpolated;
      y = CalculateChebyshevPolynomial(*c, x);
    }

    x_prev = x;
    y_prev = y;
  }

  return false;
}